

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void handle_D_option(char *z)

{
  char **ppcVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  
  lVar4 = (long)nDefine;
  nDefine = nDefine + 1;
  ppcVar1 = (char **)realloc(azDefine,lVar4 * 8 + 8);
  azDefine = ppcVar1;
  if (ppcVar1 != (char **)0x0) {
    sVar2 = strlen(z);
    pcVar3 = (char *)malloc((long)((int)sVar2 + 1));
    ppcVar1[lVar4] = pcVar3;
    if (pcVar3 != (char *)0x0) {
      lemon_strcpy(pcVar3,z);
      for (pcVar3 = ppcVar1[lVar4]; (*pcVar3 != '\0' && (*pcVar3 != '=')); pcVar3 = pcVar3 + 1) {
      }
      *pcVar3 = '\0';
      return;
    }
  }
  fwrite("out of memory\n",0xe,1,_stderr);
  exit(1);
}

Assistant:

static void handle_D_option(char *z){
  char **paz;
  nDefine++;
  azDefine = (char **) realloc(azDefine, sizeof(azDefine[0])*nDefine);
  if( azDefine==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  paz = &azDefine[nDefine-1];
  *paz = (char *) malloc( lemonStrlen(z)+1 );
  if( *paz==0 ){
    fprintf(stderr,"out of memory\n");
    exit(1);
  }
  lemon_strcpy(*paz, z);
  for(z=*paz; *z && *z!='='; z++){}
  *z = 0;
}